

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

void __thiscall pbrt::DisneyMaterial::readFrom(DisneyMaterial *this,BinaryReader *binary)

{
  BinaryReader *in_RSI;
  vec3f *in_RDI;
  
  Material::readFrom(&this->super_Material,binary);
  BinaryReader::read<float,void>(in_RSI,&in_RDI->x);
  BinaryReader::read<float,void>(in_RSI,&in_RDI->x);
  BinaryReader::read<float,void>(in_RSI,&in_RDI->x);
  BinaryReader::read<pbrt::math::vec3f,void>(in_RSI,in_RDI);
  BinaryReader::read<float,void>(in_RSI,&in_RDI->x);
  BinaryReader::read<float,void>(in_RSI,&in_RDI->x);
  BinaryReader::read<float,void>(in_RSI,&in_RDI->x);
  BinaryReader::read<float,void>(in_RSI,&in_RDI->x);
  BinaryReader::read<float,void>(in_RSI,&in_RDI->x);
  BinaryReader::read<float,void>(in_RSI,&in_RDI->x);
  BinaryReader::read<float,void>(in_RSI,&in_RDI->x);
  BinaryReader::read<float,void>(in_RSI,&in_RDI->x);
  BinaryReader::read<float,void>(in_RSI,&in_RDI->x);
  BinaryReader::read<bool,void>(in_RSI,(bool *)in_RDI);
  return;
}

Assistant:

void DisneyMaterial::readFrom(BinaryReader &binary) 
  {
    Material::readFrom(binary);
    binary.read(anisotropic);
    binary.read(clearCoat);
    binary.read(clearCoatGloss);
    binary.read(color);
    binary.read(diffTrans);
    binary.read(eta);
    binary.read(flatness);
    binary.read(metallic);
    binary.read(roughness);
    binary.read(sheen);
    binary.read(sheenTint);
    binary.read(specTrans);
    binary.read(specularTint);
    binary.read(thin);
  }